

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

roaring_bitmap_t * roaring_from_sentinel_array(int *data,_Bool copy_on_write)

{
  roaring_bitmap_t *r;
  byte in_SIL;
  int *in_RDI;
  roaring_bitmap_t *ans;
  uint32_t in_stack_0000002c;
  roaring_bitmap_t *in_stack_00000030;
  int *local_8;
  
  r = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(r,(_Bool)(in_SIL & 1));
  for (local_8 = in_RDI; *local_8 != -1; local_8 = local_8 + 1) {
    roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  }
  return r;
}

Assistant:

static roaring_bitmap_t *roaring_from_sentinel_array(int *data,
                                                     bool copy_on_write) {
    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, copy_on_write);

    for (; *data != -1; ++data) {
        roaring_bitmap_add(ans, *data);
    }
    return ans;
}